

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O1

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::addControlDep
          (SDGDependenciesBuilder *this,DepDGElement *elem,Value *on)

{
  DGBBlock *pDVar1;
  DGBBlock *pDVar2;
  _Rb_tree_node_base *p_Var3;
  pointer *pppDVar4;
  DGBBlock *local_38;
  
  if ((on == (Value *)0x0) || (on[0x10] != (Value)0x15)) {
    pDVar2 = (DGBBlock *)SystemDependenceGraph::getNode(this->_sdg,on);
    pDVar1 = (DGBBlock *)0x0;
    if (1 < *(int *)&(pDVar2->super_DepDGElement).field_0xc) {
      pDVar1 = pDVar2;
    }
    if (pDVar1 != (DGBBlock *)0x0 && *(int *)&(pDVar1->super_DepDGElement).field_0xc == 6) {
      pDVar2 = *(DGBBlock **)
                ((long)&pDVar1[1].super_DepDGElement._use_deps.
                        super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl.
                        super__Rb_tree_header + 8);
      if (pDVar2 == (DGBBlock *)0x0) {
        pDVar2 = (DGBBlock *)dg::sdg::DGParameters::createNoReturn();
      }
      local_38 = pDVar2;
      std::
      _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
      ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                  *)&elem->_control_deps,(DepDGElement **)&local_38);
      local_38 = (DGBBlock *)elem;
      std::
      _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
      ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                  *)&(pDVar2->super_DepDGElement)._rev_control_deps,(DepDGElement **)&local_38);
      p_Var3 = *(_Rb_tree_node_base **)&pDVar1[1].super_DepDGElement.field_0x8;
      pppDVar4 = &(pDVar1->_nodes).
                  super__Vector_base<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      if (p_Var3 == (_Rb_tree_node_base *)pppDVar4) {
        return;
      }
      do {
        pDVar1 = *(DGBBlock **)(*(long *)(p_Var3 + 1) + 0x18);
        if (pDVar1 == (DGBBlock *)0x0) {
          pDVar1 = (DGBBlock *)dg::sdg::DGParameters::createNoReturn();
        }
        local_38 = pDVar1;
        std::
        _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
        ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                  ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                    *)&(pDVar2->super_DepDGElement)._control_deps,(DepDGElement **)&local_38);
        local_38 = pDVar2;
        std::
        _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
        ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                  ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                    *)&(pDVar1->super_DepDGElement)._rev_control_deps,(DepDGElement **)&local_38);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)pppDVar4);
      return;
    }
  }
  else {
    pDVar1 = SystemDependenceGraph::getBBlock(this->_sdg,(BasicBlock *)on);
  }
  local_38 = pDVar1;
  std::
  _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
  ::_M_insert_unique<dg::sdg::DepDGElement*const&>
            ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
              *)&elem->_control_deps,(DepDGElement **)&local_38);
  local_38 = (DGBBlock *)elem;
  std::
  _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
  ::_M_insert_unique<dg::sdg::DepDGElement*const&>
            ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
              *)&(pDVar1->super_DepDGElement)._rev_control_deps,(DepDGElement **)&local_38);
  return;
}

Assistant:

void addControlDep(sdg::DepDGElement *elem, const llvm::Value *on) {
        if (const auto *depB = llvm::dyn_cast<llvm::BasicBlock>(on)) {
            auto *depblock = _sdg.getBBlock(depB);
            assert(depblock && "Do not have the block");
            elem->addControlDep(*depblock);
        } else {
            auto *depnd = sdg::DepDGElement::get(_sdg.getNode(on));
            assert(depnd && "Do not have the node");

            if (auto *C = sdg::DGNodeCall::get(depnd)) {
                // this is 'noret' dependence (we have no other control deps for
                // calls)
                auto *noret = C->getParameters().getNoReturn();
                if (!noret)
                    noret = &C->getParameters().createNoReturn();
                elem->addControlDep(*noret);

                // add CD to all formal norets
                for (auto *calledF : C->getCallees()) {
                    auto *fnoret = calledF->getParameters().getNoReturn();
                    if (!fnoret)
                        fnoret = &calledF->getParameters().createNoReturn();
                    noret->addControlDep(*fnoret);
                }
            } else {
                elem->addControlDep(*depnd);
            }
        }
    }